

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O2

void haggle_till_done(artifact *art,object *obj)

{
  wchar_t index;
  char *prop_name;
  int16_t *piVar1;
  int16_t *piVar2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  int iVar10;
  wchar_t wVar11;
  object_kind *kind;
  obj_property *poVar12;
  short sVar13;
  char *pcVar14;
  int iVar15;
  int16_t *piVar16;
  element_info *peVar17;
  int16_t *piVar18;
  bool bVar19;
  int local_48;
  
  if (art == (artifact *)0x0) {
    wVar9 = (wchar_t)obj->tval;
    wVar11 = (wchar_t)obj->sval;
  }
  else {
    wVar9 = art->tval;
    wVar11 = art->sval;
  }
  kind = lookup_kind(wVar9,wVar11);
  _Var3 = tval_is_melee_weapon_k(kind);
  _Var4 = tval_is_launcher_k(kind);
  uVar6 = Rand_div(6);
  if ((uVar6 == 0) && (L'ᆓ' < potential)) {
    get_property(art,obj,"strength",L'\x01',true);
    get_property(art,obj,"wisdom",L'\x01',true);
    get_property(art,obj,"intelligence",L'\x01',true);
    get_property(art,obj,"dexterity",L'\x01',true);
    get_property(art,obj,"constitution",L'\x01',true);
  }
  else {
    uVar6 = Rand_div(3);
    if ((uVar6 != 0) && (L'˭' < potential)) {
      uVar6 = Rand_div(2);
      iVar15 = potential / 2000;
      uVar8 = Rand_div(2);
      for (iVar10 = 0; iVar10 <= (int)uVar6; iVar10 = iVar10 + 1) {
        uVar7 = Rand_div(_Var3 + 9);
        if (uVar7 < 10) {
          get_property(art,obj,&DAT_0021cc30 + *(int *)(&DAT_0021cc30 + (ulong)uVar7 * 4),
                       uVar8 + iVar15 + L'\x01',true);
        }
      }
    }
  }
  uVar6 = Rand_div(8);
  if (uVar6 == 0) {
    uVar6 = Rand_div(0xd);
    switch(uVar6) {
    case 0:
      pcVar14 = "acid resistance";
      break;
    case 1:
      pcVar14 = "electricity resistance";
      break;
    case 2:
      pcVar14 = "fire resistance";
      break;
    case 3:
      pcVar14 = "cold resistance";
      break;
    case 4:
      pcVar14 = "poison resistance";
      break;
    case 5:
      pcVar14 = "light resistance";
      break;
    case 6:
      pcVar14 = "dark resistance";
      break;
    case 7:
      pcVar14 = "sound resistance";
      break;
    case 8:
      pcVar14 = "shards resistance";
      break;
    case 9:
      pcVar14 = "nexus resistance";
      break;
    case 10:
      pcVar14 = "nether resistance";
      break;
    case 0xb:
      pcVar14 = "chaos resistance";
      break;
    case 0xc:
      pcVar14 = "disenchantment resistance";
      break;
    default:
      goto switchD_00185dec_default;
    }
    _Var5 = has_property(art,obj,pcVar14);
    if (!_Var5) {
      uVar6 = Rand_div(6);
      get_property(art,obj,pcVar14,uVar6 * -5 + L'\xfffffffb',true);
    }
  }
switchD_00185dec_default:
  if ((L'ߐ' < potential) && (uVar6 = Rand_div(3), uVar6 != 0)) {
    uVar6 = Rand_div(5);
    switch(uVar6) {
    case 0:
      pcVar14 = "telepathy";
      break;
    case 1:
      pcVar14 = "hold life";
      break;
    case 2:
      _Var5 = has_property(art,obj,"protection from confusion");
      if (!_Var5) {
        get_property(art,obj,"protection from confusion",L'\0',true);
      }
      pcVar14 = "protection from blindness";
      break;
    case 3:
      uVar8 = Rand_div(4);
      if (uVar8 != 0) {
LAB_00185fd5:
        uVar8 = Rand_div(3);
        if (uVar8 == 0) {
          pcVar14 = "nether resistance";
          _Var5 = has_property(art,obj,"nether resistance");
          if (!_Var5) goto LAB_00186041;
        }
        uVar8 = Rand_div(2);
        if (uVar8 == 0) {
          pcVar14 = "chaos resistance";
          _Var5 = has_property(art,obj,"chaos resistance");
          if (!_Var5) goto LAB_00186041;
        }
        pcVar14 = "poison resistance";
        break;
      }
      pcVar14 = "disenchantment resistance";
      _Var5 = has_property(art,obj,"disenchantment resistance");
      if (_Var5) goto LAB_00185fd5;
      goto LAB_00186041;
    default:
      goto switchD_00185f6b_default;
    }
    _Var5 = has_property(art,obj,pcVar14);
    if (!_Var5) {
LAB_00186041:
      get_property(art,obj,pcVar14,L'\0',true);
    }
switchD_00185f6b_default:
    if ((uVar6 == 4) && (L'ᆔ' < potential)) {
      uVar6 = Rand_div(2);
      if ((uVar6 != 0) || (_Var5 = has_property(art,obj,"speed"), _Var5)) {
        get_property(art,obj,"sustain strength",L'\0',true);
        get_property(art,obj,"sustain wisdom",L'\0',true);
        get_property(art,obj,"sustain intelligence",L'\0',true);
        get_property(art,obj,"sustain dexterity",L'\0',true);
        pcVar14 = "sustain constitution";
        wVar9 = L'\0';
      }
      else {
        uVar6 = Rand_div(10);
        wVar9 = uVar6 + L'\x01';
        pcVar14 = "speed";
      }
      get_property(art,obj,pcVar14,wVar9,true);
    }
  }
  uVar6 = Rand_div(5);
  if (((int)uVar6 < 2) || (L'ઽ' < potential)) {
    uVar6 = Rand_div(3);
    uVar8 = Rand_div(_Var3 | 8);
    if (uVar8 < 9) {
      get_property(art,obj,&DAT_0021cc58 + *(int *)(&DAT_0021cc58 + (ulong)uVar8 * 4),
                   uVar6 + L'\x01',true);
    }
  }
  iVar15 = -0x14;
  local_48 = 5;
LAB_00186197:
  if ((potential < L'Ĭ') || (iVar15 == 0)) goto LAB_00186f52;
  if (_Var3) {
    if (art == (artifact *)0x0) {
      __assert_fail("art",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                    ,0xb53,"void haggle_till_done(struct artifact *, struct object *)");
    }
    _Var5 = flag_has_dbg(art->flags,6,0x29,"art->flags","OF_THROWING");
    if ((_Var5) && (uVar6 = Rand_div(2), uVar6 == 0)) {
      get_property(art,obj,"perfect balance",L'\0',true);
    }
    _Var5 = has_property(art,obj,"enhanced dice");
    if (_Var5) {
      uVar6 = Rand_div(3);
      if ((uVar6 == 0) && (L'כ' < potential)) {
        if (art->weight == kind->weight) {
          uVar6 = Rand_div(3);
          if (uVar6 == 0) {
            uVar6 = Rand_div(art->weight / 10);
            wVar9 = uVar6 * 5 + art->weight + L'\n';
            art->weight = wVar9;
            iVar10 = (wVar9 - kind->weight) * 10;
          }
          else {
            uVar6 = Rand_div(2);
            if ((uVar6 != 0) || (art->weight < L'\x96')) goto LAB_00186318;
            uVar6 = Rand_div((uint)art->weight / 10);
            wVar9 = uVar6 * -5 + art->weight + L'\xfffffff6';
            art->weight = wVar9;
            iVar10 = (kind->weight - wVar9) * -10;
          }
          potential = potential + iVar10;
        }
LAB_00186318:
        uVar6 = Rand_div(3);
        if ((uVar6 == 0) && (initial_potential < L'ྡ')) {
          uVar6 = Rand_div(3);
          if (uVar6 != 0) {
            art->to_h = 0;
            potential = potential + L'ɘ';
            uVar6 = Rand_div(4);
            if (uVar6 == 0) {
              art->to_h = 0;
              potential = potential + L'ɘ';
            }
          }
          get_property(art,obj,"enhanced dice",L'\x01',true);
LAB_00186f52:
          wVar11 = Rand_div(5);
          iVar15 = 3;
          wVar9 = L'\0';
          while (bVar19 = local_48 != 0, local_48 = local_48 + -1, bVar19) {
            poVar12 = lookup_obj_property(L'\x01',wVar9);
            pcVar14 = poVar12->name;
            index = wVar9 + L'\x01';
            poVar12 = lookup_obj_property(L'\x03',index);
            bVar19 = wVar11 == wVar9;
            wVar9 = index;
            if (bVar19) {
              prop_name = poVar12->name;
              _Var4 = has_property(art,obj,pcVar14);
              if (_Var4) {
                get_property(art,obj,prop_name,L'\0',true);
              }
            }
          }
          if (((_Var3) && (uVar6 = Rand_div(4), uVar6 == 0)) || (uVar6 = Rand_div(2), uVar6 == 0)) {
            uVar6 = Rand_div(6);
            if ((int)uVar6 < 4) {
              peVar17 = art->el_info;
              if (art == (artifact *)0x0) {
                peVar17 = obj->el_info;
              }
              peVar17[(int)uVar6].res_level = (int16_t)((peVar17[(int)uVar6].res_level * 2) / 3);
            }
            else {
              if (uVar6 == 5) {
                pcVar14 = "feather falling";
              }
              else {
                if (uVar6 != 4) goto LAB_00187056;
                pcVar14 = "slow digestion";
              }
              get_property(art,obj,pcVar14,L'\0',true);
            }
          }
LAB_00187056:
          piVar1 = &obj->to_a;
          piVar2 = &obj->to_h;
          piVar18 = &obj->to_d;
          if (art != (artifact *)0x0) {
            piVar18 = &art->to_d;
            piVar1 = &art->to_a;
            piVar2 = &art->to_h;
          }
LAB_00187082:
          iVar10 = iVar15 + -1;
          if (iVar15 == 0) {
            return;
          }
          piVar16 = piVar1;
          if (iVar15 == 2) {
            piVar16 = piVar2;
          }
          if (iVar15 == 1) {
            piVar16 = piVar18;
          }
          sVar13 = *piVar16;
          iVar15 = iVar10;
          if (sVar13 % 5 == 4) {
            uVar6 = Rand_div(2);
            sVar13 = *piVar16;
            if (uVar6 != 0) goto LAB_001870c7;
            goto LAB_0018710a;
          }
LAB_001870c7:
          if (sVar13 % 5 != 1) goto LAB_001870e4;
          uVar6 = Rand_div(2);
          sVar13 = *piVar16;
          if (uVar6 != 0) goto LAB_001870e4;
          sVar13 = sVar13 + -1;
          goto LAB_00187110;
        }
      }
    }
    else {
      uVar6 = Rand_div((uint)art->ds * (uint)art->dd);
      if (((int)uVar6 < 4) || (L'࠳' < potential)) {
        get_property(art,obj,"enhanced dice",L'\x03',true);
      }
    }
    uVar6 = Rand_div(0xd);
    switch(uVar6) {
    case 0:
      _Var5 = has_property(art,obj,"slay animals");
      if (!_Var5) {
        pcVar14 = "slay animals";
LAB_00186574:
        wVar9 = L'\x11';
LAB_00186576:
        get_property(art,obj,pcVar14,wVar9,true);
      }
      break;
    case 1:
      _Var5 = has_property(art,obj,"slay evil creatures");
      if (!_Var5) {
        pcVar14 = "slay evil creatures";
        wVar9 = L'\x0f';
        goto LAB_00186576;
      }
      break;
    case 2:
      _Var5 = has_property(art,obj,"slay undead");
      if (!_Var5) {
        pcVar14 = "slay undead";
LAB_00186528:
        wVar9 = L'\x14';
        goto LAB_00186576;
      }
      break;
    case 3:
      _Var5 = has_property(art,obj,"slay demons");
      if (!_Var5) {
        pcVar14 = "slay demons";
        goto LAB_00186528;
      }
      break;
    case 4:
      _Var5 = has_property(art,obj,"slay orcs");
      if (!_Var5) {
        pcVar14 = "slay orcs";
        goto LAB_00186528;
      }
      break;
    case 5:
      _Var5 = has_property(art,obj,"slay trolls");
      if (!_Var5) {
        pcVar14 = "slay trolls";
        goto LAB_00186528;
      }
      break;
    case 6:
      _Var5 = has_property(art,obj,"slay giants");
      if (!_Var5) {
        pcVar14 = "slay giants";
        goto LAB_00186528;
      }
      break;
    case 7:
      _Var5 = has_property(art,obj,"slay dragons");
      if (!_Var5) {
        pcVar14 = "slay dragons";
        goto LAB_00186528;
      }
      break;
    case 8:
      _Var5 = has_property(art,obj,"acid brand");
      if (!_Var5) {
        pcVar14 = "acid brand";
        goto LAB_00186574;
      }
      break;
    case 9:
      _Var5 = has_property(art,obj,"lightning brand");
      if (!_Var5) {
        pcVar14 = "lightning brand";
        goto LAB_00186574;
      }
      break;
    case 10:
      _Var5 = has_property(art,obj,"fire brand");
      if (!_Var5) {
        pcVar14 = "fire brand";
        goto LAB_00186574;
      }
      break;
    case 0xb:
      _Var5 = has_property(art,obj,"cold brand");
      if (!_Var5) {
        pcVar14 = "cold brand";
        goto LAB_00186574;
      }
      break;
    case 0xc:
      _Var5 = has_property(art,obj,"poison brand");
      if (!_Var5) {
        pcVar14 = "poison brand";
        goto LAB_00186574;
      }
    }
    uVar6 = Rand_div(2);
    if (uVar6 == 0) {
      uVar6 = Rand_div(8);
      switch(uVar6) {
      case 0:
        _Var5 = has_property(art,obj,"slow digestion");
        if (!_Var5) {
          pcVar14 = "slow digestion";
LAB_001866fc:
          wVar9 = L'\0';
LAB_001866fe:
          get_property(art,obj,pcVar14,wVar9,false);
        }
        break;
      case 1:
        _Var5 = has_property(art,obj,"feather falling");
        if (!_Var5) {
          pcVar14 = "feather falling";
          goto LAB_001866fc;
        }
        break;
      case 2:
        _Var5 = has_property(art,obj,"light");
        if (!_Var5) {
          pcVar14 = "light";
          wVar9 = L'\x01';
          goto LAB_001866fe;
        }
        break;
      case 3:
        _Var5 = has_property(art,obj,"regeneration");
        if (!_Var5) {
          pcVar14 = "regeneration";
          goto LAB_001866fc;
        }
        break;
      case 4:
        _Var5 = has_property(art,obj,"see invisible");
        if (!_Var5) {
          pcVar14 = "see invisible";
          goto LAB_001866fc;
        }
        break;
      case 5:
        _Var5 = has_property(art,obj,"free action");
        if (!_Var5) {
          pcVar14 = "free action";
          goto LAB_001866fc;
        }
        break;
      case 6:
        _Var5 = has_property(art,obj,"protection from fear");
        if (!_Var5) {
          pcVar14 = "protection from fear";
          goto LAB_001866fc;
        }
        break;
      case 7:
        _Var5 = has_property(art,obj,"protection from blindness");
        if (!_Var5) {
          pcVar14 = "protection from blindness";
          goto LAB_001866fc;
        }
      }
    }
    uVar6 = Rand_div(3);
    if (uVar6 == 0) {
      uVar6 = Rand_div(0xb);
      switch(uVar6) {
      case 0:
        pcVar14 = "acid resistance";
        break;
      case 1:
        pcVar14 = "electricity resistance";
        break;
      case 2:
        pcVar14 = "fire resistance";
        break;
      case 3:
        pcVar14 = "cold resistance";
        break;
      case 4:
        pcVar14 = "poison resistance";
        break;
      case 5:
        pcVar14 = "light resistance";
        break;
      case 6:
        pcVar14 = "dark resistance";
        break;
      case 7:
        pcVar14 = "sound resistance";
        break;
      case 8:
        pcVar14 = "shards resistance";
        break;
      case 9:
        pcVar14 = "nexus resistance";
        break;
      case 10:
        pcVar14 = "disenchantment resistance";
        break;
      default:
        goto switchD_00186737_default;
      }
      _Var5 = has_property(art,obj,pcVar14);
      if (!_Var5) {
        uVar6 = Rand_div(5);
        get_property(art,obj,pcVar14,uVar6 * 5 + L'#',true);
      }
    }
switchD_00186737_default:
    if ((potential < L'Ǵ') && (uVar6 = Rand_div(5), uVar6 == 0)) {
      _Var5 = has_property(art,obj,"deadliness bonus");
      if (_Var5) {
        get_property(art,obj,"deadliness bonus",potential / 0x96,true);
      }
      _Var5 = has_property(art,obj,"skill bonus");
      if (_Var5) {
        get_property(art,obj,"skill bonus",potential / 0x96,true);
      }
      potential = L'\0';
    }
  }
  if (_Var4) {
    uVar6 = Rand_div(8);
    switch(uVar6) {
    case 0:
      _Var5 = has_property(art,obj,"slow digestion");
      if (!_Var5) {
        pcVar14 = "slow digestion";
LAB_00186a40:
        wVar9 = L'\0';
LAB_00186a42:
        get_property(art,obj,pcVar14,wVar9,false);
      }
      break;
    case 1:
      _Var5 = has_property(art,obj,"feather falling");
      if (!_Var5) {
        pcVar14 = "feather falling";
        goto LAB_00186a40;
      }
      break;
    case 2:
      _Var5 = has_property(art,obj,"light");
      if (!_Var5) {
        pcVar14 = "light";
        wVar9 = L'\x01';
        goto LAB_00186a42;
      }
      break;
    case 3:
      _Var5 = has_property(art,obj,"regeneration");
      if (!_Var5) {
        pcVar14 = "regeneration";
        goto LAB_00186a40;
      }
      break;
    case 4:
      _Var5 = has_property(art,obj,"see invisible");
      if (!_Var5) {
        pcVar14 = "see invisible";
        goto LAB_00186a40;
      }
      break;
    case 5:
      _Var5 = has_property(art,obj,"free action");
      if (!_Var5) {
        pcVar14 = "free action";
        goto LAB_00186a40;
      }
      break;
    case 6:
      _Var5 = has_property(art,obj,"protection from fear");
      if (!_Var5) {
        pcVar14 = "protection from fear";
        goto LAB_00186a40;
      }
      break;
    case 7:
      _Var5 = has_property(art,obj,"protection from blindness");
      if (!_Var5) {
        pcVar14 = "protection from blindness";
        goto LAB_00186a40;
      }
    }
    uVar6 = Rand_div(2);
    if (uVar6 == 0) {
      uVar6 = Rand_div(0xb);
      switch(uVar6) {
      case 0:
        pcVar14 = "acid resistance";
        break;
      case 1:
        pcVar14 = "electricity resistance";
        break;
      case 2:
        pcVar14 = "fire resistance";
        break;
      case 3:
        pcVar14 = "cold resistance";
        break;
      case 4:
        pcVar14 = "poison resistance";
        break;
      case 5:
        pcVar14 = "light resistance";
        break;
      case 6:
        pcVar14 = "dark resistance";
        break;
      case 7:
        pcVar14 = "sound resistance";
        break;
      case 8:
        pcVar14 = "shards resistance";
        break;
      case 9:
        pcVar14 = "nexus resistance";
        break;
      case 10:
        pcVar14 = "disenchantment resistance";
        break;
      default:
        goto switchD_00186a7b_default;
      }
      _Var5 = has_property(art,obj,pcVar14);
      if (!_Var5) {
        uVar6 = Rand_div(5);
        get_property(art,obj,pcVar14,uVar6 * 5 + L'#',true);
      }
    }
switchD_00186a7b_default:
    if ((potential < L'Ǵ') && (uVar6 = Rand_div(5), uVar6 == 0)) {
      _Var5 = has_property(art,obj,"deadliness bonus");
      if (_Var5) {
        get_property(art,obj,"deadliness bonus",potential / 0x96,true);
      }
      _Var5 = has_property(art,obj,"skill bonus");
      if (_Var5) {
        get_property(art,obj,"skill bonus",potential / 0x96,true);
      }
      potential = L'\0';
    }
  }
  uVar6 = Rand_div(0xb);
  switch(uVar6) {
  case 0:
    pcVar14 = "acid resistance";
    break;
  case 1:
    pcVar14 = "electricity resistance";
    break;
  case 2:
    pcVar14 = "fire resistance";
    break;
  case 3:
    pcVar14 = "cold resistance";
    break;
  case 4:
    pcVar14 = "poison resistance";
    break;
  case 5:
    pcVar14 = "light resistance";
    break;
  case 6:
    pcVar14 = "dark resistance";
    break;
  case 7:
    pcVar14 = "sound resistance";
    break;
  case 8:
    pcVar14 = "shards resistance";
    break;
  case 9:
    pcVar14 = "nexus resistance";
    break;
  case 10:
    pcVar14 = "disenchantment resistance";
    break;
  default:
    goto switchD_00186c27_default;
  }
  _Var5 = has_property(art,obj,pcVar14);
  if (!_Var5) {
    uVar6 = Rand_div(5);
    get_property(art,obj,pcVar14,uVar6 * 5 + L'#',true);
  }
switchD_00186c27_default:
  uVar6 = Rand_div(3);
  if (uVar6 == 0) {
    uVar6 = Rand_div(8);
    switch(uVar6) {
    case 0:
      _Var5 = has_property(art,obj,"slow digestion");
      if (!_Var5) {
        pcVar14 = "slow digestion";
LAB_00186e9a:
        wVar9 = L'\0';
LAB_00186e9c:
        get_property(art,obj,pcVar14,wVar9,false);
      }
      break;
    case 1:
      _Var5 = has_property(art,obj,"feather falling");
      if (!_Var5) {
        pcVar14 = "feather falling";
        goto LAB_00186e9a;
      }
      break;
    case 2:
      _Var5 = has_property(art,obj,"light");
      if (!_Var5) {
        pcVar14 = "light";
        wVar9 = L'\x01';
        goto LAB_00186e9c;
      }
      break;
    case 3:
      _Var5 = has_property(art,obj,"regeneration");
      if (!_Var5) {
        pcVar14 = "regeneration";
        goto LAB_00186e9a;
      }
      break;
    case 4:
      _Var5 = has_property(art,obj,"see invisible");
      if (!_Var5) {
        pcVar14 = "see invisible";
        goto LAB_00186e9a;
      }
      break;
    case 5:
      _Var5 = has_property(art,obj,"free action");
      if (!_Var5) {
        pcVar14 = "free action";
        goto LAB_00186e9a;
      }
      break;
    case 6:
      _Var5 = has_property(art,obj,"protection from fear");
      if (!_Var5) {
        pcVar14 = "protection from fear";
        goto LAB_00186e9a;
      }
      break;
    case 7:
      _Var5 = has_property(art,obj,"protection from blindness");
      if (!_Var5) {
        pcVar14 = "protection from blindness";
        goto LAB_00186e9a;
      }
    }
    if (((potential < L'Ǵ') && (uVar6 = Rand_div(5), uVar6 == 0)) &&
       (_Var5 = has_property(art,obj,"armor bonus"), _Var5)) {
      get_property(art,obj,"armor bonus",potential / 100,true);
      potential = L'\0';
    }
  }
  iVar15 = iVar15 + 1;
  goto LAB_00186197;
LAB_001870e4:
  if ((((int)sVar13 & 0x80000001U) == 1) && (uVar6 = Rand_div(4), uVar6 != 0)) {
    sVar13 = *piVar16;
LAB_0018710a:
    sVar13 = sVar13 + 1;
LAB_00187110:
    *piVar16 = sVar13;
  }
  goto LAB_00187082;
}

Assistant:

static void haggle_till_done(struct artifact *art, struct object *obj)
{
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	int i;
	int bonus = 0;
	int choice = 0;
	int limit = 20;
	bool weapon = tval_is_melee_weapon_k(kind);
	bool launcher = tval_is_launcher_k(kind);

	/* Initial bonuses */
	if ((one_in_(6)) && (potential >= 4500)) {
		/* Rarely, and only if the artifact has a lot of potential, add all the
		 * stats. */
		get_property(art, obj, "strength", 1, true);
		get_property(art, obj, "wisdom", 1, true);
		get_property(art, obj, "intelligence", 1, true);
		get_property(art, obj, "dexterity", 1, true);
		get_property(art, obj, "constitution", 1, true);
	} else if (!one_in_(3) && (potential >= 750)) {
		/* Otherwise, if at least some potential remains, add a numerical bonus
		 * quality or two with 67% probability. */
		int rounds = randint1(2);
		bonus = potential / 2000 + randint1(2);

		for (i = 0; i < rounds; i++) {
			/* Only melee weapons can get a bonus to tunnelling. */
			if (weapon) {
				choice = randint1(10);
			} else {
				choice = randint1(9);
			}
			switch (choice) {
				case 1: get_property(art, obj, "strength", bonus, true); break;
				case 2: get_property(art, obj, "wisdom", bonus, true); break;
				case 3: get_property(art, obj, "intelligence", bonus, true);
					break;
				case 4: get_property(art, obj, "dexterity", bonus, true);
					break;
				case 5: get_property(art, obj, "constitution", bonus, true);
					break;
				case 6: get_property(art, obj, "infravision", bonus, true);
					break;
				case 7: get_property(art, obj, "stealth", bonus, true); break;
				case 8: get_property(art, obj, "searching skill", bonus, true);
					break;
				case 9: get_property(art, obj, "speed", bonus, true); break;
				case 10: get_property(art, obj, "tunneling", bonus, true);
					break;
				default: break;
			}
		}
	}

	/* Sometimes, collect a vulnerability in exchange for more potential */
	if (one_in_(8)) {
		choice = randint1(13);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance", -5 * randint1(6), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance", -5 * randint1(6),
						 true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance", -5 * randint1(6), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance", -5 * randint1(6), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance", -5 * randint1(6), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance", -5 * randint1(6), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance", -5 * randint1(6), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance", -5 * randint1(6), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance", -5 * randint1(6), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance", -5 * randint1(6), true);
		}
		if ((choice == 11) && !has_property(art, obj, "nether resistance")) {
			get_property(art, obj, "nether resistance", -5 * randint1(6), true);
		}
		if ((choice == 12) && !has_property(art, obj, "chaos resistance")) {
			get_property(art, obj, "chaos resistance", -5 * randint1(6), true);
		}
		if ((choice == 13) && !has_property(art, obj,
											"disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 -5 * randint1(6), true);
		}
	}

	/* Artifacts that still have lots of money to spend deserve the best. */
	if ((potential > 2000) && !one_in_(3)) {

		/* Make a choice... */
		choice = randint1(5);
		/* ...among some tasty options. */
		if ((choice == 1) && !has_property(art, obj, "telepathy")) {
			get_property(art, obj, "telepathy", 0, true);
		}
		if ((choice == 2) && !has_property(art, obj, "hold life")) {
			get_property(art, obj, "hold life", 0, true);
		}
		if (choice == 3) {
			if (!has_property(art, obj, "protection from confusion")) {
				get_property(art, obj, "protection from confusion", 0, true);
			}
			if (!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, true);
			}
		}
		if (choice == 4) {
			if (one_in_(4) && !has_property(art, obj,
											"disenchantment resistance")) {
				get_property(art, obj, "disenchantment resistance", 0, true);
			} else if (one_in_(3) && !has_property(art, obj,
												   "nether resistance")) {
				get_property(art, obj, "nether resistance", 0, true);
			} else if (one_in_(2) && !has_property(art, obj,
												   "chaos resistance")) {
				get_property(art, obj, "chaos resistance", 0, true);
			} else if (!has_property(art, obj, "poison resistance")) {
				get_property(art, obj, "poison resistance", 0, true);
			}
		}
		if ((choice == 5) && (potential > 4500)) {
			if (one_in_(2) && !has_property(art, obj, "speed")) {
				get_property(art, obj, "speed", randint1(10), true);
			}

			else {
				get_property(art, obj, "sustain strength", 0, true);
				get_property(art, obj, "sustain wisdom", 0, true);
				get_property(art, obj, "sustain intelligence", 0, true);
				get_property(art, obj, "sustain dexterity", 0, true);
				get_property(art, obj, "sustain constitution", 0, true);
			}
		}
	}

	/* Sometimes, also add a new numerical bonus quality. Infravision and
	 * magical item mastery are not on offer. Only melee weapons can get a
	 * bonus to tunnelling. */
	if ((randint1(5) < 3) || (potential >= 2750)) {
		bonus = randint1(3);
		if (weapon) {
			choice = randint1(9);
		} else {
			choice = randint1(8);
		}
		if (choice == 1) {
			get_property(art, obj, "strength", bonus, true);
		}
		if (choice == 2) {
			get_property(art, obj, "wisdom", bonus, true);
		}
		if (choice == 3) {
			get_property(art, obj, "intelligence", bonus, true);
		}
		if (choice == 4) {
			get_property(art, obj, "dexterity", bonus, true);
		}
		if (choice == 5) {
			get_property(art, obj, "constitution", bonus, true);
		}
		if (choice == 6) {
			get_property(art, obj, "stealth", bonus, true);
		}
		if (choice == 7) {
			get_property(art, obj, "searching skill", bonus, true);
		}
		if (choice == 8) {
			get_property(art, obj, "speed", bonus, true);
		}
		if (choice == 9) {
			get_property(art, obj, "tunneling", bonus, true);
		}
	}

	/* Now, we enter Filene's Basement, and shop 'til we drop! (well, nearly) */
	while ((potential >= 300) && (limit-- > 0)) {

		/* I'm a melee weapon. */
		if (weapon) {
			/* Should be an artifact */
			assert(art);

			/* Some throwing weapons can be thrown hard and fast. */
			if (of_has(art->flags, OF_THROWING) && one_in_(2))
				get_property(art, obj, "perfect balance", 0, true);
			/* Some weapons already will have superb base damage. */
			if (has_property(art, obj, "enhanced dice")) {

				/* Sometimes, such weapons are unusual. */
				if (one_in_(3) && (potential >= 1500)) {
					if (art->weight == kind->weight) {
						if (one_in_(3)) {
							/* Sometimes, such weapons are unusually heavy. */
							art->weight += randint1(art->weight / 10) * 5 + 5;
							potential += (art->weight - kind->weight) * 10;
						} else if (one_in_(2) && (art->weight >= 150)) {
							/* Sometimes, such weapons are unusually light. */
							art->weight -= randint1(art->weight / 10) * 5 + 5;
							potential -= (kind->weight - art->weight) * 10;
						}
					}

					/* Sometimes spend everything to enhance the damage dice.
					 * SJGU assuming there wasn't too much to start with... */
					if (one_in_(3) && (initial_potential <= 4000)) {

						/* Probably sacrifice the Skill bonus. */
						if (!one_in_(3)) {
							art->to_h = 0;
							potential += 600;
							/* Possibly also sacrifice the Deadliness bonus. */
							if (one_in_(4)) {
								art->to_h = 0;
								potential += 600;
							}
						}
						get_property(art, obj, "enhanced dice", 1, true);
						/* We're done */
						break;
					}
				}
			} else if (randint1(art->dd * art->ds) < 5 || potential >= 2100) {
				/* Other weapons have enhanced damage dice in addition to other
				 * qualities.
				 * SJGU increased chance of this as small dice are useless */
				get_property(art, obj, "enhanced dice", 3, true);
			}

			/* Collect a slay or brand. */
			choice = randint1(13);
			if ((choice == 1) && !has_property(art, obj, "slay animals")) {
				get_property(art, obj, "slay animals", 17, true);
			}
			if ((choice == 2) && !has_property(art, obj,
											   "slay evil creatures")) {
				get_property(art, obj, "slay evil creatures", 15, true);
			}
			if ((choice == 3) && !has_property(art, obj, "slay undead")) {
				get_property(art, obj, "slay undead", 20, true);
			}
			if ((choice == 4) && !has_property(art, obj, "slay demons")) {
				get_property(art, obj, "slay demons", 20, true);
			}
			if ((choice == 5) && !has_property(art, obj, "slay orcs")) {
				get_property(art, obj, "slay orcs", 20, true);
			}
			if ((choice == 6) && !has_property(art, obj, "slay trolls")) {
				get_property(art, obj, "slay trolls", 20, true);
			}
			if ((choice == 7) && !has_property(art, obj, "slay giants")) {
				get_property(art, obj, "slay giants", 20, true);
			}
			if ((choice == 8) && !has_property(art, obj, "slay dragons")) {
				get_property(art, obj, "slay dragons", 20, true);
			}
			if ((choice == 9) && !has_property(art, obj, "acid brand")) {
				get_property(art, obj, "acid brand", 17, true);
			}
			if ((choice == 10) && !has_property(art, obj, "lightning brand")) {
				get_property(art, obj, "lightning brand", 17, true);
			}
			if ((choice == 11) && !has_property(art, obj, "fire brand")) {
				get_property(art, obj, "fire brand", 17, true);
			}
			if ((choice == 12) && !has_property(art, obj, "cold brand")) {
				get_property(art, obj, "cold brand", 17, true);
			}
			if ((choice == 13) && !has_property(art, obj, "poison brand")) {
				get_property(art, obj, "poison brand", 17, true);
			}
			/* Often, collect a miscellaneous quality, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(8);
				if ((choice == 1) && !has_property(art, obj, "slow digestion")){
					get_property(art, obj, "slow digestion", 0, false);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "feather falling")) {
					get_property(art, obj, "feather falling", 0, false);
				}
				if ((choice == 3) && !has_property(art, obj, "light")) {
					get_property(art, obj, "light", 1, false);
				}
				if ((choice == 4) && !has_property(art, obj, "regeneration")) {
					get_property(art, obj, "regeneration", 0, false);
				}
				if ((choice == 5) && !has_property(art, obj, "see invisible")) {
					get_property(art, obj, "see invisible", 0, false);
				}
				if ((choice == 6) && !has_property(art, obj, "free action")) {
					get_property(art, obj, "free action", 0, false);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "protection from fear")) {
					get_property(art, obj, "protection from fear", 0, false);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "protection from blindness")) {
					get_property(art, obj, "protection from blindness", 0,
								 false);
				}
			}

			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(3)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm a missile weapon. */
		if (launcher) {
			/* Collect a miscellaneous quality. */
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}
			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm any piece of armour or jewellery. */

		/* Collect a resistance. */
		choice = randint1(11);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 11) &&
			!has_property(art, obj, "disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 35 + 5 * randint0(5), true);
		}
		/* Sometimes, collect a miscellaneous quality, if it is affordable. */
		if (one_in_(3)) {
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "armor bonus")) {
					get_property(art, obj, "armor bonus", potential/ 100, true);
					potential = 0;
				}
			}
		}
	}

	/* On sale free! Last chance! */

	/* If an artifact affects a stat, it may also possibly sustain it. */
	choice = randint0(STAT_MAX);
	for (i = 0; i < STAT_MAX; i++) {
		const char *stat = lookup_obj_property(OBJ_PROPERTY_STAT, i)->name;
		const char *sust = lookup_obj_property(OBJ_PROPERTY_FLAG, i + 1)->name;
		if ((choice == i) && has_property(art, obj, stat)) {
			get_property(art, obj, sust, 0, true);
		}
	}

	/* Armour gets a basic resist or low-level ability with 50% probability,
	 * and weapons with 25% probability. */
	if ((weapon && one_in_(4)) || one_in_(2)) {
		int16_t *res;
		choice = randint0(6);
		res = art ? &(art->el_info[choice].res_level) :
			&(obj->el_info[choice].res_level);
		if (choice < 4) {
			*res = ((*res) * 2) / 3;
		} else if (choice == 4) {
			get_property(art, obj, "slow digestion", 0, true);
		} else if (choice == 5) {
			get_property(art, obj, "feather falling", 0, true);
		}
	}

	/* Frequently neaten bonuses to Armour Class, Skill, and Deadliness. */
	for (i = 0; i < 3; i++) {
		int16_t *bonus_chg = art ? &art->to_a : &obj->to_a;
		if (i == 1) { 
			bonus_chg = art ? &art->to_h : &obj->to_h;
		}
		if (i == 2) { 
			bonus_chg = art ? &art->to_d : &obj->to_d;
		}
		if (((*bonus_chg) % 5 == 4) && one_in_(2)) {
			(*bonus_chg)++;
		} else if (((*bonus_chg) % 5 == 1) && one_in_(2)) {
			(*bonus_chg)--;
		} else if (((*bonus_chg) % 2 == 1) && !one_in_(4)) {
			(*bonus_chg)++;
		}
	}
}